

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::UniformBufferStorageTestCase::initTestCaseIteration
          (UniformBufferStorageTestCase *this,GLuint sparse_bo)

{
  GLenum GVar1;
  bool result;
  GLuint sparse_bo_local;
  UniformBufferStorageTestCase *this_local;
  
  this->m_sparse_bo = sparse_bo;
  (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x199c);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x199f);
  (*this->m_gl->bindBuffer)(0x8c8e,this->m_tf_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x19a2);
  return true;
}

Assistant:

bool UniformBufferStorageTestCase::initTestCaseIteration(glw::GLuint sparse_bo)
{
	bool result = true;

	/* Cache the BO id, if not cached already */
	DE_ASSERT(m_sparse_bo == 0 || m_sparse_bo == sparse_bo);

	m_sparse_bo = sparse_bo;

	/* Set up the sparse buffer bindings. */
	m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_tf_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	return result;
}